

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

void * IM483IThread(void *pParam)

{
  double angle_00;
  int iVar1;
  double angle;
  int err;
  int res;
  int id;
  IM483I *pIM483I;
  void *pParam_local;
  
  err = 0;
  angle._4_4_ = 0;
  do {
    if (addrsIM483I[err] == pParam) {
      mSleep((long)*(int *)((long)pParam + 0x52c));
      do {
        EnterCriticalSection(IM483ICS + err);
        angle_00 = angleIM483I[err];
        LeaveCriticalSection(IM483ICS + err);
        iVar1 = SetMaxAngleIM483I((IM483I *)pParam,angle_00);
        if (iVar1 != 0) {
          angle._4_4_ = iVar1;
        }
        mSleep((long)*(int *)((long)pParam + 0x52c));
        EnterCriticalSection(IM483ICS + err);
        resIM483I[err] = angle._4_4_;
        LeaveCriticalSection(IM483ICS + err);
      } while (bExitIM483I[err] == 0);
      return (void *)0x0;
    }
    err = err + 1;
  } while (err < 0x10);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE IM483IThread(void* pParam)
{
	IM483I* pIM483I = (IM483I*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	double angle = 0;

	while (addrsIM483I[id] != pIM483I)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	mSleep(pIM483I->threadperiod);

	for (;;)
	{
		EnterCriticalSection(&IM483ICS[id]);
		angle = angleIM483I[id];
		LeaveCriticalSection(&IM483ICS[id]);
		res = SetMaxAngleIM483I(pIM483I, angle);
		if (res != EXIT_SUCCESS) err = res;
		mSleep(pIM483I->threadperiod);
		EnterCriticalSection(&IM483ICS[id]);
		resIM483I[id] = err;
		LeaveCriticalSection(&IM483ICS[id]);
		if (bExitIM483I[id]) break;
	}

	return 0;
}